

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint realsize;
  uint *input;
  etdc_table **table_00;
  uint *voc;
  void *pvVar1;
  uchar *in_RSI;
  uint *decoded;
  uint i;
  uint size;
  uint *items;
  uint *voctable;
  int newsize;
  uint voc_size;
  uchar *output;
  etdc_table *table;
  uint uVar2;
  uint size_00;
  etdc_table **in_stack_ffffffffffffffd0;
  etdc_table *table_01;
  uint size_01;
  uint voc_size_00;
  
  voc_size_00 = 0;
  table_01 = (etdc_table *)0x0;
  size_00 = 10000000;
  input = (uint *)malloc(40000000);
  for (uVar2 = 0; uVar2 < size_00; uVar2 = uVar2 + 1) {
    input[uVar2] = uVar2;
  }
  table_00 = (etdc_table **)malloc((ulong)size_00 << 2);
  realsize = firstpass(in_stack_ffffffffffffffd0,input,size_00);
  printf("Table: ");
  etdc_print((etdc_table *)CONCAT44(size_00,uVar2));
  etdc_encode((etdc_table **)&stack0xffffffffffffffe8,input,size_00,(uchar *)table_00);
  voc = (uint *)malloc((ulong)realsize << 2);
  etdc_voc2uint(table_01,voc);
  for (uVar2 = 0; size_01 = (uint)((ulong)table_01 >> 0x20), uVar2 < realsize; uVar2 = uVar2 + 1) {
    printf("voc[%u] = %u\n",(ulong)uVar2,(ulong)voc[uVar2]);
  }
  etdc_free(table_00);
  pvVar1 = malloc((ulong)size_00 << 2);
  etdc_decode(decoded,voc_size_00,in_RSI,size_01,(uint *)table_00,realsize);
  for (uVar2 = 0; uVar2 < size_00; uVar2 = uVar2 + 1) {
    if (input[uVar2] != *(uint *)((long)pvVar1 + (ulong)uVar2 * 4)) {
      printf("waaa %u %u\n",(ulong)input[uVar2],(ulong)*(uint *)((long)pvVar1 + (ulong)uVar2 * 4));
    }
  }
  free(table_00);
  printf("END\n");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  struct etdc_table *table = NULL;
  unsigned char *output;
  unsigned int voc_size;
  int newsize;
  unsigned int *voctable;

  unsigned int *items;
  unsigned int size;
  unsigned int i;

  unsigned int *decoded;

  size = 10000000;
  items = (unsigned int *)malloc(sizeof(unsigned int)*size);
  for(i=0; i < size; i++) items[i]=i;

  
  output = (unsigned char*)malloc(sizeof(unsigned int)*size);
  voc_size = firstpass(&table, items, size);
  printf("Table: "); etdc_print(table);


  newsize = etdc_encode(&table, items, size, output);

  voctable = (unsigned int*) malloc(sizeof(unsigned int)*voc_size);
  etdc_voc2uint(table,voctable);
  for (i=0; i<voc_size;i++) printf("voc[%u] = %u\n", i, voctable[i]);
  
  etdc_free(&table);

  decoded = (unsigned int*)malloc(sizeof(unsigned int)*size);
  etdc_decode(voctable, voc_size, output, newsize, decoded, size);

  for(i=0; i<size; i++) {
    if(items[i] != decoded[i]) {
      printf("waaa %u %u\n", items[i], decoded[i]);
    }

  }

  free(output);

  printf("END\n");
  return 0;
}